

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sam_header.c
# Opt level: O1

int sam_hdr_add_lines(SAM_hdr *sh,char *lines,int len)

{
  char cVar1;
  char cVar2;
  size_t sVar3;
  SAM_hdr_type **ppSVar4;
  SAM_hdr_item_s *pSVar5;
  SAM_hdr_item_s *pSVar6;
  khint_t kVar7;
  size_t sVar8;
  ulong uVar9;
  char *pcVar10;
  long lVar11;
  SAM_hdr_type *h_type;
  SAM_hdr_tag *pSVar12;
  char *pcVar13;
  char *pcVar14;
  ulong uVar15;
  int j;
  int iVar16;
  uint uVar17;
  int iVar18;
  uint uVar19;
  size_t __size;
  size_t __n;
  size_t sVar20;
  ulong uVar21;
  int iVar22;
  int lno;
  ulong uVar23;
  bool bVar24;
  bool bVar25;
  int new;
  SAM_hdr_tag *local_50;
  int local_34;
  
  sVar8 = (size_t)(uint)len;
  if (len == 0) {
    sVar8 = strlen(lines);
  }
  sVar3 = (sh->text).l;
  lno = (int)sVar8;
  __n = (size_t)lno;
  uVar9 = __n + sVar3 + 1;
  if ((sh->text).m <= uVar9) {
    uVar9 = uVar9 >> 1 | uVar9;
    uVar9 = uVar9 >> 2 | uVar9;
    uVar9 = uVar9 >> 4 | uVar9;
    uVar9 = uVar9 >> 8 | uVar9;
    __size = (uVar9 >> 0x10 | uVar9) + 1;
    (sh->text).m = __size;
    pcVar10 = (char *)realloc((sh->text).s,__size);
    if (pcVar10 == (char *)0x0) {
      return -1;
    }
    (sh->text).s = pcVar10;
  }
  uVar9 = sVar8 & 0xffffffff;
  memcpy((sh->text).s + (sh->text).l,lines,__n);
  sVar20 = __n + (sh->text).l;
  (sh->text).l = sVar20;
  (sh->text).s[sVar20] = '\0';
  iVar16 = -1;
  if (lno != -1) {
    if (0 < lno) {
      iVar16 = (int)sVar3;
      pcVar10 = (sh->text).s;
      iVar18 = 0;
      uVar23 = uVar9;
      do {
        lVar11 = (long)iVar18;
        pcVar13 = pcVar10 + lVar11 + iVar16;
        if (pcVar10[lVar11 + iVar16] == '@') {
          cVar1 = pcVar13[1];
          uVar19 = (int)cVar1 - 0x7b;
          if ((byte)uVar19 < 0xc6) {
LAB_0013273b:
            uVar23 = (ulong)uVar19;
            pcVar14 = "Header line does not have a two character key";
            goto LAB_0013274b;
          }
          cVar2 = pcVar13[2];
          uVar19 = (int)cVar2 - 0x7b;
          if ((byte)uVar19 < 0xc6) goto LAB_0013273b;
          uVar15 = lVar11 + 3;
          iVar22 = (int)uVar15;
          uVar23 = uVar15;
          if (pcVar10[lVar11 + (long)iVar16 + 3] == '\n') {
            bVar25 = false;
          }
          else {
            h_type = (SAM_hdr_type *)pool_alloc(sh->type_pool);
            bVar25 = true;
            if (h_type != (SAM_hdr_type *)0x0) {
              uVar19 = (int)cVar1 << 8 | (int)cVar2;
              kVar7 = kh_put_sam_hdr(sh->h,uVar19,&local_34);
              if (kVar7 != 0xffffffff) {
                ppSVar4 = sh->h->vals;
                if (local_34 == 0) {
                  pSVar5 = ppSVar4[kVar7];
                  pSVar6 = pSVar5->prev;
                  pSVar6->next = pSVar5;
                  if (pSVar5 == (SAM_hdr_item_s *)0x0) {
                    __assert_fail("p->next = t",
                                  "/workspace/llm4binary/github/license_c_cmakelists/gatoravi[P]bam-parser-tutorial/htslib/cram/sam_header.c"
                                  ,0x144,"int sam_hdr_add_lines(SAM_hdr *, const char *, int)");
                  }
                  pSVar6->next = h_type;
                  h_type->prev = pSVar6;
                  pSVar5->prev = h_type;
                  h_type->next = pSVar5;
                  iVar22 = pSVar6->order + 1;
                }
                else {
                  ppSVar4[kVar7] = h_type;
                  h_type->next = h_type;
                  h_type->prev = h_type;
                  iVar22 = 0;
                }
                h_type->order = iVar22;
                if (cVar2 == 'O' && cVar1 == 'C') {
                  if (pcVar10[uVar15 + (long)iVar16] == '\t') {
                    uVar17 = iVar18 + 4;
                    uVar15 = (ulong)(int)uVar17;
                    uVar21 = (ulong)uVar17;
                    uVar23 = uVar15;
                    if ((int)uVar17 < lno) {
                      do {
                        uVar21 = uVar23;
                        if (pcVar10[uVar23 + (long)iVar16] == '\n') break;
                        uVar23 = uVar23 + 1;
                        uVar21 = uVar9;
                      } while (uVar9 != uVar23);
                    }
                    uVar23 = uVar9;
                    pSVar12 = (SAM_hdr_tag *)pool_alloc(sh->tag_pool);
                    h_type->tag = pSVar12;
                    if (pSVar12 == (SAM_hdr_tag *)0x0) {
                      bVar24 = false;
                      uVar15 = (ulong)uVar17;
                    }
                    else {
                      iVar18 = (int)uVar21 - uVar17;
                      pcVar13 = string_ndup(sh->str_pool,pcVar10 + uVar15 + (long)iVar16,
                                            (long)iVar18);
                      pSVar12->str = pcVar13;
                      pSVar12->len = iVar18;
                      pSVar12->next = (SAM_hdr_tag_s *)0x0;
                      bVar24 = pcVar13 != (char *)0x0;
                      if (bVar24) {
                        uVar15 = uVar21;
                      }
                      uVar15 = uVar15 & 0xffffffff;
                    }
                  }
                  else {
                    uVar23 = uVar9;
                    sam_hdr_error("Missing tab",pcVar13,lno - iVar18,lno);
                    bVar24 = false;
                  }
                  iVar22 = (int)uVar15;
                  if (!bVar24) goto LAB_0013278d;
                }
                else {
                  local_50 = (SAM_hdr_tag *)0x0;
                  do {
                    if (pcVar10[(long)(int)uVar15 + (long)iVar16] == '\t') {
                      uVar17 = (int)uVar15 + 1;
                      uVar15 = (ulong)uVar17;
                      uVar23 = (ulong)uVar17;
                      uVar21 = (long)(int)uVar17;
                      if ((int)uVar17 < lno) {
                        do {
                          uVar23 = uVar21;
                          if ((byte)(pcVar10[uVar21 + (long)iVar16] - 9U) < 2) break;
                          uVar21 = uVar21 + 1;
                          uVar23 = uVar9;
                        } while (uVar9 != uVar21);
                      }
                      pSVar12 = (SAM_hdr_tag *)pool_alloc(sh->tag_pool);
                      if (pSVar12 != (SAM_hdr_tag *)0x0) {
                        iVar22 = (int)uVar23 - uVar17;
                        pcVar14 = string_ndup(sh->str_pool,
                                              pcVar10 + (long)(int)uVar17 + (long)iVar16,
                                              (long)iVar22);
                        pSVar12->str = pcVar14;
                        pSVar12->len = iVar22;
                        pSVar12->next = (SAM_hdr_tag_s *)0x0;
                        if (pcVar14 != (char *)0x0) {
                          if ((2 < iVar22) && (pcVar14[2] == ':')) {
                            if (local_50 == (SAM_hdr_tag *)0x0) {
                              h_type->tag = pSVar12;
                            }
                            else {
                              local_50->next = pSVar12;
                            }
                            bVar24 = true;
                            uVar15 = uVar23 & 0xffffffff;
                            local_50 = pSVar12;
                            goto LAB_001326c0;
                          }
                          sam_hdr_error("Malformed key:value pair",pcVar13,lno - iVar18,lno);
                        }
                      }
                      bVar24 = false;
                    }
                    else {
                      sam_hdr_error("Missing tab",pcVar13,lno - iVar18,lno);
                      bVar24 = false;
                    }
LAB_001326c0:
                    iVar22 = (int)uVar15;
                    uVar23 = uVar9;
                    if (!bVar24) goto LAB_0013278d;
                  } while ((iVar22 < lno) && (pcVar10[(long)iVar22 + (long)iVar16] != '\n'));
                }
                iVar18 = sam_hdr_update_hashes(sh,uVar19,h_type);
                bVar25 = iVar18 == -1;
                uVar23 = (ulong)bVar25;
              }
            }
          }
        }
        else {
          pcVar14 = "Header line does not start with \'@\'";
LAB_0013274b:
          sam_hdr_error(pcVar14,pcVar13,lno - iVar18,(int)uVar23);
          bVar25 = true;
          iVar22 = iVar18;
        }
LAB_0013278d:
        if (bVar25) {
          return -1;
        }
        iVar18 = iVar22 + 1;
      } while (iVar18 < lno);
    }
    iVar16 = 0;
  }
  return iVar16;
}

Assistant:

int sam_hdr_add_lines(SAM_hdr *sh, const char *lines, int len) {
    int i, lno = 1, text_offset;
    char *hdr;

    if (!len)
	len = strlen(lines);

    text_offset = ks_len(&sh->text);
    if (EOF == kputsn(lines, len, &sh->text))
	return -1;
    hdr = ks_str(&sh->text) + text_offset;

    for (i = 0; i < len; i++) {
	khint32_t type;
	khint_t k;

	int l_start = i, new;
	SAM_hdr_type *h_type;
	SAM_hdr_tag *h_tag, *last;

	if (hdr[i] != '@') {
	    int j;
	    for (j = i; j < len && hdr[j] != '\n'; j++)
		;
	    sam_hdr_error("Header line does not start with '@'",
			  &hdr[l_start], len - l_start, lno);
	    return -1;
	}

	type = (hdr[i+1]<<8) | hdr[i+2];
	if (hdr[i+1] < 'A' || hdr[i+1] > 'z' ||
	    hdr[i+2] < 'A' || hdr[i+2] > 'z') {
	    sam_hdr_error("Header line does not have a two character key",
			  &hdr[l_start], len - l_start, lno);
	    return -1;
	}

	i += 3;
	if (hdr[i] == '\n')
	    continue;

	// Add the header line type
	if (!(h_type = pool_alloc(sh->type_pool)))
	    return -1;
	if (-1 == (k = kh_put(sam_hdr, sh->h, type, &new)))
	    return -1;

	// Form the ring, either with self or other lines of this type
	if (!new) {
	    SAM_hdr_type *t = kh_val(sh->h, k), *p;
	    p = t->prev;
	    
	    assert(p->next = t);
	    p->next = h_type;
	    h_type->prev = p;

	    t->prev = h_type;
	    h_type->next = t;
	    h_type->order = p->order+1;
	} else {
	    kh_val(sh->h, k) = h_type;
	    h_type->prev = h_type->next = h_type;
	    h_type->order = 0;
	}

	// Parse the tags on this line
	last = NULL;
	if ((type>>8) == 'C' && (type&0xff) == 'O') {
	    int j;
	    if (hdr[i] != '\t') {
		sam_hdr_error("Missing tab",
			      &hdr[l_start], len - l_start, lno);
		return -1;
	    }

	    for (j = ++i; j < len && hdr[j] != '\n'; j++)
		;

	    if (!(h_type->tag = h_tag = pool_alloc(sh->tag_pool)))
		return -1;
	    h_tag->str = string_ndup(sh->str_pool, &hdr[i], j-i);
	    h_tag->len = j-i;
	    h_tag->next = NULL;
	    if (!h_tag->str)
		return -1;

	    i = j;

	} else {
	    do {
		int j;
		if (hdr[i] != '\t') {
		    sam_hdr_error("Missing tab",
				  &hdr[l_start], len - l_start, lno);
		    return -1;
		}

		for (j = ++i; j < len && hdr[j] != '\n' && hdr[j] != '\t'; j++)
		    ;
	    
		if (!(h_tag = pool_alloc(sh->tag_pool)))
		    return -1;
		h_tag->str = string_ndup(sh->str_pool, &hdr[i], j-i);
		h_tag->len = j-i;
		h_tag->next = NULL;
		if (!h_tag->str)
		    return -1;

		if (h_tag->len < 3 || h_tag->str[2] != ':') {
		    sam_hdr_error("Malformed key:value pair",
				  &hdr[l_start], len - l_start, lno);
		    return -1;
		}
	    
		if (last)
		    last->next = h_tag;
		else
		    h_type->tag = h_tag;

		last = h_tag;
		i = j;
	    } while (i < len && hdr[i] != '\n');
	}

	/* Update RG/SQ hashes */
	if (-1 == sam_hdr_update_hashes(sh, type, h_type))
	    return -1;
    }

    return 0;
}